

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O3

ErrorType __thiscall
Network::Client::MQTTv5::disconnect(MQTTv5 *this,ReasonCodes code,Properties *properties)

{
  Impl *this_00;
  PropertyBase *pPVar1;
  ErrorType EVar2;
  PropertyBase *pPVar3;
  ControlPacketSerializable local_b8;
  undefined ***local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined2 local_9c;
  undefined ***local_98;
  undefined ***local_90;
  undefined ***local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined **local_70;
  undefined ***local_68;
  undefined4 local_60;
  undefined **local_58;
  undefined1 local_50;
  undefined **local_48;
  undefined **local_40;
  anon_union_4_2_f99d0578_for_VBInt_1 local_38;
  uint16 local_34;
  PropertyBase *local_30;
  PropertyBase *pPStack_28;
  undefined **local_20;
  
  EVar2.errorCode = -4;
  if (0x7f < (int)code || (code & ~DisconnectWithWillMessage) == GrantedQoS0) {
    this_00 = this->impl;
    if (this_00->socket == (BaseSocket *)0x0) {
      EVar2.errorCode = 0;
    }
    else {
      local_b0 = &local_80;
      local_98 = &local_70;
      local_90 = &local_48;
      local_88 = &local_20;
      local_a8 = &PTR_getSize_0012ecf0;
      local_9c = 1;
      local_a0 = 0;
      local_b8.super_Serializable._vptr_Serializable = (Serializable)&PTR_getSize_0012fd80;
      local_78 = 0xe0;
      local_80 = &PTR_getType_0012fc58;
      local_68 = &local_58;
      local_60 = 1;
      local_58 = &PTR_typeSize_0012fcf8;
      local_70 = &PTR_getSize_0012fc90;
      local_48 = &PTR_getSize_0012f530;
      local_40 = &PTR_getSize_0012ecf0;
      local_34 = 1;
      local_38.value = local_38.value & 0xffffff00;
      pPStack_28 = (PropertyBase *)0x0;
      local_20 = &PTR_getSize_0012f5d8;
      local_50 = (undefined1)code;
      if (properties != (Properties *)0x0) {
        pPStack_28 = properties->head;
        local_38 = (properties->length).field_0;
        local_34 = (properties->length).size;
      }
      (this_00->super_ImplBase<Network::Client::MQTTv5::Impl>).state = Disconnecting;
      local_30 = pPStack_28;
      EVar2 = ImplBase<Network::Client::MQTTv5::Impl>::prepareSAR
                        (&this_00->super_ImplBase<Network::Client::MQTTv5::Impl>,&local_b8,false,
                         false);
      if (EVar2.errorCode == 0) {
        ImplBase<Network::Client::MQTTv5::Impl>::close
                  (&this->impl->super_ImplBase<Network::Client::MQTTv5::Impl>,0x80);
      }
      pPVar3 = pPStack_28;
      if (local_30 != pPStack_28 && local_30 != (PropertyBase *)0x0) {
        do {
          pPVar1 = local_30->next;
          if (local_30->heapAllocated == true) {
            (*(local_30->super_Serializable)._vptr_Serializable[6])();
            pPVar3 = pPStack_28;
          }
        } while ((pPVar1 != (PropertyBase *)0x0) && (local_30 = pPVar1, pPVar1 != pPVar3));
      }
    }
  }
  return (ErrorType)EVar2.errorCode;
}

Assistant:

MQTTv5::ErrorType MQTTv5::disconnect(const ReasonCodes code, Properties * properties)
    {
        if (code != ReasonCodes::NormalDisconnection && code != ReasonCodes::DisconnectWithWillMessage && code < ReasonCodes::UnspecifiedError)
            return ErrorType::BadParameter;


        if (!impl->isOpen()) return ErrorType::Success;

        Protocol::MQTT::V5::ControlPacket<Protocol::MQTT::V5::DISCONNECT> packet;
        packet.fixedVariableHeader.reasonCode = code;
        // Capture properties (to avoid copying them)
        packet.props.capture(properties);

#if MQTTAvoidValidation != 1
        if (!packet.props.checkPropertiesFor(Protocol::MQTT::V5::DISCONNECT))
            return ErrorType::BadProperties;
#endif

        impl->setConnectionState(State::Disconnecting);
        if (ErrorType ret = impl->prepareSAR(packet, false))
            return ret;

        // There is no need to wait for ACK for a disconnect
        impl->close();
        return ErrorType::Success;
    }